

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lex.c
# Opt level: O2

yy_state_type yy_get_previous_state(void)

{
  uint uVar1;
  int iVar2;
  byte *pbVar4;
  byte bVar5;
  long lVar6;
  ulong uVar3;
  
  uVar1 = (uint)yy_start;
  pbVar4 = (byte *)yytext;
LAB_0016bb2e:
  uVar3 = (ulong)uVar1;
  if (yy_c_buf_p <= pbVar4) {
    return uVar1;
  }
  if ((ulong)*pbVar4 == 0) {
    bVar5 = 1;
  }
  else {
    bVar5 = ""[*pbVar4];
  }
  if ((0xa9c06c000000007U >> (uVar3 & 0x3f) & 1) == 0) {
    yy_last_accepting_state = uVar1;
    yy_last_accepting_cpos = (char *)pbVar4;
  }
  do {
    do {
      iVar2 = (int)uVar3;
      lVar6 = (long)yy_base[iVar2] + (ulong)bVar5;
      if (iVar2 == yy_chk[lVar6]) {
        uVar1 = (uint)yy_nxt[lVar6];
        pbVar4 = pbVar4 + 1;
        goto LAB_0016bb2e;
      }
      uVar3 = (ulong)(uint)(int)yy_def[iVar2];
    } while (yy_def[iVar2] < 0x3c);
    bVar5 = ""[bVar5];
  } while( true );
}

Assistant:

static yy_state_type yy_get_previous_state (void)
{
	yy_state_type yy_current_state;
	char *yy_cp;
    
	yy_current_state = (yy_start);

	for ( yy_cp = (yytext_ptr) + YY_MORE_ADJ; yy_cp < (yy_c_buf_p); ++yy_cp )
		{
		YY_CHAR yy_c = (*yy_cp ? yy_ec[YY_SC_TO_UI(*yy_cp)] : 1);
		if ( yy_accept[yy_current_state] )
			{
			(yy_last_accepting_state) = yy_current_state;
			(yy_last_accepting_cpos) = yy_cp;
			}
		while ( yy_chk[yy_base[yy_current_state] + yy_c] != yy_current_state )
			{
			yy_current_state = (int) yy_def[yy_current_state];
			if ( yy_current_state >= 60 )
				yy_c = yy_meta[yy_c];
			}
		yy_current_state = yy_nxt[yy_base[yy_current_state] + yy_c];
		}

	return yy_current_state;
}